

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O1

void __thiscall FOOLElimination::apply(FOOLElimination *this,UnitList **units)

{
  List<Kernel::Unit_*> **ppLVar1;
  Clause *this_00;
  UnitList *pUVar2;
  List<Kernel::Unit_*> *pLVar3;
  Clause *pCVar4;
  UnitList *pUVar5;
  undefined8 *puVar6;
  long lVar7;
  UnitList *pUVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  pUVar8 = *units;
  ppLVar1 = units;
  do {
    if (pUVar8 == (UnitList *)0x0) {
      pUVar8 = this->_defs;
      pUVar2 = *units;
      pUVar5 = pUVar2;
      if ((pUVar8 != (UnitList *)0x0) &&
         (pUVar5 = pUVar8, pLVar3 = pUVar8, pUVar2 != (UnitList *)0x0)) {
        do {
          pUVar8 = pLVar3;
          pLVar3 = pUVar8->_tail;
        } while (pLVar3 != (List<Kernel::Unit_*> *)0x0);
        pUVar8->_tail = pUVar2;
      }
      *units = pUVar5;
      this->_defs = (UnitList *)0x0;
      return;
    }
    pUVar8 = *ppLVar1;
    this_00 = (Clause *)pUVar8->_head;
    if (((this_00->super_Unit).field_0x4 & 1) == 0) {
      if ((*(ulong *)&this_00->field_0x38 & 0xfffff) != 0) {
        lVar7 = 0;
        do {
          if (((this_00->_literals[lVar7]->super_Term)._args[0]._content & 8) == 0) {
            puVar6 = (undefined8 *)__cxa_allocate_exception(0x50);
            Kernel::Clause::literalsOnlyToString_abi_cxx11_(&local_48,this_00);
            std::operator+(&local_68,
                           "Input clauses (cnf) cannot use $ite, $let or $o terms. Error in ",
                           &local_48);
            *puVar6 = &PTR_cry_00b69f40;
            puVar6[1] = puVar6 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar6 + 1),local_68._M_dataplus._M_p,
                       local_68._M_dataplus._M_p + local_68._M_string_length);
            *puVar6 = &PTR_cry_00b6a028;
            *(undefined4 *)(puVar6 + 5) = 0;
            puVar6[6] = puVar6 + 8;
            puVar6[7] = 0;
            *(undefined1 *)(puVar6 + 8) = 0;
            __cxa_throw(puVar6,&::Lib::UserErrorException::typeinfo,
                        ::Lib::UserErrorException::~UserErrorException);
          }
          lVar7 = lVar7 + 1;
        } while (((uint)*(ulong *)&this_00->field_0x38 & 0xfffff) != (uint)lVar7);
      }
    }
    else {
      pCVar4 = (Clause *)apply(this,(FormulaUnit *)this_00);
      if (pCVar4 != this_00) {
        pUVar8->_head = (Unit *)pCVar4;
      }
    }
    ppLVar1 = &pUVar8->_tail;
    pUVar8 = pUVar8->_tail;
  } while( true );
}

Assistant:

void FOOLElimination::apply(UnitList*& units) {
  UnitList::DelIterator us(units);
  while(us.hasNext()) {
    Unit* unit = us.next();
    if(unit->isClause()) {
      Clause* clause = static_cast<Clause*>(unit);
      for (unsigned i = 0; i < clause->length(); i++) {
        // we do not allow special terms in clauses so we check that all clause literals
        // are shared (special terms can not be shared)
        if(!(*clause)[i]->shared()){
          USER_ERROR("Input clauses (cnf) cannot use $ite, $let or $o terms. Error in "+clause->literalsOnlyToString());
        }
      }
      continue;
    }
    Unit* processedUnit = apply(static_cast<FormulaUnit*>(unit));
    if (processedUnit != unit) {
      us.replace(processedUnit);
    }
  }

  // Note that the "$true != $false" axiom is treated as a theory axiom and
  // added in TheoryAxiom.cpp

  units = UnitList::concat(_defs, units);
  _defs = 0;
}